

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O1

int Abc_NodeCheckDupFanin(Abc_Obj_t *pFanin,Abc_Obj_t *pFanout,int *piFanin)

{
  int *piVar1;
  void **ppvVar2;
  int iVar3;
  long lVar4;
  
  if (0 < (pFanout->vFanins).nSize) {
    piVar1 = (pFanout->vFanins).pArray;
    ppvVar2 = pFanout->pNtk->vObjs->pArray;
    lVar4 = 0;
    iVar3 = 0;
    do {
      if ((Abc_Obj_t *)ppvVar2[piVar1[lVar4]] == pFanin) {
        if (piFanin != (int *)0x0) {
          *piFanin = (int)lVar4;
        }
        iVar3 = iVar3 + 1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (pFanout->vFanins).nSize);
    return iVar3;
  }
  return 0;
}

Assistant:

int Abc_NodeCheckDupFanin( Abc_Obj_t * pFanin, Abc_Obj_t * pFanout, int * piFanin )
{
    Abc_Obj_t * pObj;
    int i, Counter = 0;
    Abc_ObjForEachFanin( pFanout, pObj, i )
        if ( pObj == pFanin )
        {
            if ( piFanin )
                *piFanin = i;
            Counter++;
        }
    return Counter;
}